

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsInputSetDefaultString(HelicsInput inp,char *str,HelicsError *err)

{
  InputObject *pIVar1;
  Input *in_RSI;
  InputObject *inpObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  Input *in_stack_ffffffffffffff90;
  HelicsInput in_stack_ffffffffffffff98;
  bool local_42;
  allocator<char> local_41;
  allocator<char> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  pIVar1 = anon_unknown.dwarf_5d1c2::verifyInput
                     (in_stack_ffffffffffffff98,(HelicsError *)in_stack_ffffffffffffff90);
  if (pIVar1 != (InputObject *)0x0) {
    local_42 = in_RSI == (Input *)0x0;
    if (local_42) {
      std::__cxx11::string::string(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,
                 in_stack_ffffffffffffffc0);
      in_stack_ffffffffffffff90 = in_RSI;
    }
    local_42 = !local_42;
    helics::Input::setDefault<std::__cxx11::string_const>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff90);
    if (local_42) {
      std::allocator<char>::~allocator(&local_41);
    }
  }
  return;
}

Assistant:

void helicsInputSetDefaultString(HelicsInput inp, const char* str, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }
    try {
        inpObj->inputPtr->setDefault(AS_STRING(str));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}